

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv24toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  double v;
  double u;
  double local_38;
  double local_30;
  
  puVar3 = (uint *)sp->tbuf;
  for (; 0 < n; n = n + -1) {
    uVar1 = *puVar3;
    *(ushort *)op = ((ushort)(uVar1 >> 0xc) & 0xffd) + 0x3402;
    iVar2 = uv_decode(&local_30,&local_38,uVar1 & 0x3fff);
    uVar4 = 0x3ca11af2;
    if (-1 < iVar2) {
      auVar5._0_4_ = (int)(local_30 * 32768.0);
      auVar5._4_4_ = (int)(local_38 * 32768.0);
      auVar5._8_8_ = 0;
      auVar5 = packssdw(auVar5,auVar5);
      uVar4 = auVar5._0_4_;
    }
    *(undefined4 *)((long)op + 2) = uVar4;
    op = (uint8_t *)((long)op + 6);
    puVar3 = puVar3 + 1;
  }
  return;
}

Assistant:

static void Luv24toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)((*luv >> 12 & 0xffd) + 13314);
        if (uv_decode(&u, &v, *luv & 0x3fff) < 0)
        {
            u = U_NEU;
            v = V_NEU;
        }
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}